

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer_allocator.cpp
# Opt level: O0

torrent_peer * __thiscall
libtorrent::torrent_peer_allocator::allocate_peer_entry(torrent_peer_allocator *this,int type)

{
  undefined4 in_register_00000034;
  size_t __size;
  torrent_peer *local_28;
  torrent_peer *p;
  int type_local;
  torrent_peer_allocator *this_local;
  
  __size = CONCAT44(in_register_00000034,type);
  local_28 = (torrent_peer *)0x0;
  if (type == 0) {
    local_28 = (torrent_peer *)
               boost::pool<boost::default_user_allocator_new_delete>::malloc
                         (&this->m_ipv4_peer_pool,__size);
    if (local_28 == (torrent_peer *)0x0) {
      return (torrent_peer *)0x0;
    }
    boost::pool<boost::default_user_allocator_new_delete>::set_next_size
              (&this->m_ipv4_peer_pool,500);
    this->m_total_bytes = this->m_total_bytes + 0x28;
    this->m_live_bytes = this->m_live_bytes + 0x28;
    this->m_live_allocations = this->m_live_allocations + 1;
    this->m_total_allocations = this->m_total_allocations + 1;
  }
  else if (type == 1) {
    local_28 = (torrent_peer *)
               boost::pool<boost::default_user_allocator_new_delete>::malloc
                         (&this->m_ipv6_peer_pool,__size);
    if (local_28 == (torrent_peer *)0x0) {
      return (torrent_peer *)0x0;
    }
    boost::pool<boost::default_user_allocator_new_delete>::set_next_size
              (&this->m_ipv6_peer_pool,500);
    this->m_total_bytes = this->m_total_bytes + 0x30;
    this->m_live_bytes = this->m_live_bytes + 0x30;
    this->m_live_allocations = this->m_live_allocations + 1;
    this->m_total_allocations = this->m_total_allocations + 1;
  }
  else if (type == 2) {
    local_28 = (torrent_peer *)
               boost::pool<boost::default_user_allocator_new_delete>::malloc
                         (&this->m_i2p_peer_pool,__size);
    if (local_28 == (torrent_peer *)0x0) {
      return (torrent_peer *)0x0;
    }
    boost::pool<boost::default_user_allocator_new_delete>::set_next_size(&this->m_i2p_peer_pool,500)
    ;
    this->m_total_bytes = this->m_total_bytes + 0x28;
    this->m_live_bytes = this->m_live_bytes + 0x28;
    this->m_live_allocations = this->m_live_allocations + 1;
    this->m_total_allocations = this->m_total_allocations + 1;
  }
  return local_28;
}

Assistant:

torrent_peer* torrent_peer_allocator::allocate_peer_entry(int type)
	{
		TORRENT_ASSERT(m_in_use);
		torrent_peer* p = nullptr;
		switch(type)
		{
			case torrent_peer_allocator_interface::ipv4_peer_type:
				p = static_cast<torrent_peer*>(m_ipv4_peer_pool.malloc());
				if (p == nullptr) return nullptr;
				m_ipv4_peer_pool.set_next_size(500);
				m_total_bytes += sizeof(libtorrent::ipv4_peer);
				m_live_bytes += sizeof(libtorrent::ipv4_peer);
				++m_live_allocations;
				++m_total_allocations;
				break;
			case torrent_peer_allocator_interface::ipv6_peer_type:
				p = static_cast<torrent_peer*>(m_ipv6_peer_pool.malloc());
				if (p == nullptr) return nullptr;
				m_ipv6_peer_pool.set_next_size(500);
				m_total_bytes += sizeof(libtorrent::ipv6_peer);
				m_live_bytes += sizeof(libtorrent::ipv6_peer);
				++m_live_allocations;
				++m_total_allocations;
				break;
#if TORRENT_USE_I2P
			case torrent_peer_allocator_interface::i2p_peer_type:
				p = static_cast<torrent_peer*>(m_i2p_peer_pool.malloc());
				if (p == nullptr) return nullptr;
				m_i2p_peer_pool.set_next_size(500);
				m_total_bytes += sizeof(libtorrent::i2p_peer);
				m_live_bytes += sizeof(libtorrent::i2p_peer);
				++m_live_allocations;
				++m_total_allocations;
				break;
#endif
		}
		return p;
	}